

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

dlep_parser_error
dlep_extension_router_process_destination(dlep_extension *ext,dlep_session *session)

{
  uint uVar1;
  oonf_layer2_neigh *poVar2;
  dlep_parser_error dVar3;
  
  dVar3 = DLEP_NEW_PARSER_OKAY;
  if (session->restrict_signal == DLEP_ALL_SIGNALS) {
    poVar2 = dlep_extension_get_l2_neighbor(session);
    dVar3 = DLEP_NEW_PARSER_OKAY;
    if (poVar2 != (oonf_layer2_neigh *)0x0) {
      uVar1 = dlep_reader_map_l2neigh_data(poVar2->data,session,ext);
      if (uVar1 != 0) {
        dVar3 = DLEP_NEW_PARSER_UNSUPPORTED_TLV;
        if ((log_global_mask[session->log_source] & 2) != 0) {
          oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_extension.c",0x103,
                   (void *)0x0,0,"tlv mapping for extension %d failed: %d",(ulong)(uint)ext->id,
                   (ulong)uVar1);
        }
      }
    }
  }
  return dVar3;
}

Assistant:

enum dlep_parser_error
dlep_extension_router_process_destination(struct dlep_extension *ext, struct dlep_session *session) {
  struct oonf_layer2_neigh *l2neigh;
  enum dlep_parser_error result;

  if (session->restrict_signal != DLEP_ALL_SIGNALS) {
    /* ignore unless we have an established session */
    return DLEP_NEW_PARSER_OKAY;
  }

  l2neigh = dlep_extension_get_l2_neighbor(session);
  if (!l2neigh) {
    return DLEP_NEW_PARSER_OKAY;
  }

  result = dlep_reader_map_l2neigh_data(l2neigh->data, session, ext);
  if (result) {
    OONF_INFO(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return DLEP_NEW_PARSER_UNSUPPORTED_TLV;
  }
  return DLEP_NEW_PARSER_OKAY;
}